

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

jieba_t * jieba_new(char *dict_path,char *hmm_path,char *user_dict,char *idf_path,
                   char *stop_words_path)

{
  jieba_t *pjVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  char *in_R8;
  jieba_t *handle;
  allocator *idfPath;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 uVar2;
  allocator in_stack_fffffffffffffeff;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  Jieba *in_stack_ffffffffffffff10;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [40];
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  string *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pjVar1 = (jieba_t *)operator_new(0x6d8);
  uVar2 = 1;
  idfPath = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)local_8,idfPath);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,local_10,&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,local_18,&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,local_20,&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff00,local_28,(allocator *)&stack0xfffffffffffffeff);
  cppjieba::Jieba::Jieba
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (string *)CONCAT17(in_stack_fffffffffffffeff,CONCAT16(uVar2,in_stack_fffffffffffffef8))
             ,(string *)idfPath,local_8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return pjVar1;
}

Assistant:

jieba_t* jieba_new(const char* dict_path, const char* hmm_path, const char* user_dict, const char* idf_path, const char* stop_words_path) {
  jieba_t* handle = (jieba_t*)(new cppjieba::Jieba(dict_path, hmm_path, user_dict, idf_path, stop_words_path));
  return handle;
}